

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

string * __thiscall
project::get_apple_osx_config_abi_cxx11_(string *__return_storage_ptr__,project *this)

{
  pointer pbVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer pbVar5;
  _List_node_base *p_Var6;
  buildExport b;
  stringstream ss;
  string local_450;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_430;
  buildExport local_418;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_418.targetFolder._M_dataplus._M_p = (pointer)&local_418.targetFolder.field_2;
  local_418.targetFolder._M_string_length = 0;
  local_418.targetFolder.field_2._M_local_buf[0] = '\0';
  local_418.cppLanguageStandard._M_dataplus._M_p = (pointer)&local_418.cppLanguageStandard.field_2;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.extraDefs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.externalLibraries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.cppLanguageStandard._M_string_length = 0;
  local_418.cppLanguageStandard.field_2._M_local_buf[0] = '\0';
  local_418.extraCompilerFlags._M_dataplus._M_p = (pointer)&local_418.extraCompilerFlags.field_2;
  local_418.extraCompilerFlags._M_string_length = 0;
  local_418.extraCompilerFlags.field_2._M_local_buf[0] = '\0';
  local_418.extraLinkerFlags._M_dataplus._M_p = (pointer)&local_418.extraLinkerFlags.field_2;
  local_418.extraLinkerFlags._M_string_length = 0;
  local_418.extraLinkerFlags.field_2._M_local_buf[0] = '\0';
  local_418.extraFrameworks._M_dataplus._M_p = (pointer)&local_418.extraFrameworks.field_2;
  local_418.extraFrameworks._M_string_length = 0;
  local_418.extraFrameworks.field_2._M_local_buf[0] = '\0';
  local_418.smallIcon._M_dataplus._M_p = (pointer)&local_418.smallIcon.field_2;
  local_418.smallIcon._M_string_length = 0;
  local_418.smallIcon.field_2._M_local_buf[0] = '\0';
  local_418.bigIcon._M_dataplus._M_p = (pointer)&local_418.bigIcon.field_2;
  local_418.bigIcon._M_string_length = 0;
  local_418.bigIcon.field_2._M_local_buf[0] = '\0';
  local_418.vstLegacyFolder._M_dataplus._M_p = (pointer)&local_418.vstLegacyFolder.field_2;
  local_418.vstLegacyFolder._M_string_length = 0;
  local_418.vstLegacyFolder.field_2._M_local_buf[0] = '\0';
  local_418.vst3Folder._M_dataplus._M_p = (pointer)&local_418.vst3Folder.field_2;
  local_418.vst3Folder._M_string_length = 0;
  local_418.vst3Folder.field_2._M_local_buf[0] = '\0';
  local_418.debug.name._M_dataplus._M_p = (pointer)&local_418.debug.name.field_2;
  local_418.debug.name._M_string_length = 0;
  local_418.debug.name.field_2._M_local_buf[0] = '\0';
  local_418.debug.targetName._M_dataplus._M_p = (pointer)&local_418.debug.targetName.field_2;
  local_418.debug.targetName._M_string_length = 0;
  local_418.debug.targetName.field_2._M_local_buf[0] = '\0';
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.debug.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.debug.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.name._M_dataplus._M_p = (pointer)&local_418.release.name.field_2;
  local_418.release.name._M_string_length = 0;
  local_418.release.name.field_2._M_local_buf[0] = '\0';
  local_418.release.targetName._M_dataplus._M_p = (pointer)&local_418.release.targetName.field_2;
  local_418.release.targetName._M_string_length = 0;
  local_418.release.targetName.field_2._M_local_buf[0] = '\0';
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.headerPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.release.libraryPath.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"XCODE_MAC","");
  get_export(this,&local_450,&local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if (local_418.valid == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Using XCode Config",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    if (local_418.debug.headerPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_418.debug.headerPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"            target_include_directories(",0x27);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," PUBLIC\n",8);
      pbVar1 = local_418.debug.headerPath.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_418.debug.headerPath.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"                ${CMAKE_SYSROOT}/",0x21);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"            )\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    if (local_418.extraCompilerFlags._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"            target_compile_options(",0x23);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," PUBLIC ",8);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_418.extraCompilerFlags._M_dataplus._M_p,
                          local_418.extraCompilerFlags._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    if (local_418.debug.libraryPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_418.debug.libraryPath.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"            target_link_directories(",0x24);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," BEFORE PUBLIC\n",0xf);
      pbVar1 = local_418.debug.libraryPath.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = local_418.debug.libraryPath.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1
          ) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"                ${CMAKE_SYSROOT}/",0x21);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"            )\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    get_libraries((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_430,this,&OSXFramework_abi_cxx11_);
    iVar4 = 0;
    p_Var6 = (_List_node_base *)&local_430;
    while (p_Var6 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)&local_430) {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"            find_library(FRAMEWORK",0x22);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)p_Var6[1]._M_next,(long)p_Var6[1]._M_prev);
      iVar4 = iVar4 + 1;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear(&local_430);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"            target_link_libraries(",0x22);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    pbVar1 = local_418.externalLibraries.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = local_418.externalLibraries.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"                ",0x10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    if (iVar4 != 0) {
      iVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"                ${FRAMEWORK",0x1b);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
        iVar3 = iVar3 + 1;
      } while (iVar4 != iVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"            )\n",0xe);
    std::__cxx11::stringbuf::str();
  }
  buildExport::~buildExport(&local_418);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string project::get_apple_osx_config()
{
    std::stringstream ss;

    project::buildExport b;
    get_export("XCODE_MAC", b);
    if(!b.valid)
    {
        return "";
    }
    std::cout << "Using XCode Config" << std::endl;

    if(!b.debug.headerPath.empty())
    {
        ss << "            target_include_directories(" << name << " PUBLIC\n";
        for(auto const& path : b.debug.headerPath)
        {
            ss << "                ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "            )\n";
        ss << "\n";
    }

    if(!b.extraCompilerFlags.empty())
    {
        ss << "            target_compile_options(" << name << " PUBLIC " << b.extraCompilerFlags << ")\n";
        ss << "\n";
    }

    if(!b.debug.libraryPath.empty())
    {
        ss << "            target_link_directories(" << name << " BEFORE PUBLIC\n";
        for(auto const& path : b.debug.libraryPath)
        {
            ss << "                ${CMAKE_SYSROOT}/" << path << "\n";
        }
        ss << "            )\n";
        ss << "\n";
    }

    int count = 0;
    for(auto const& framework : get_libraries(OSXFramework))
    {
        ss << "            find_library(FRAMEWORK" << count++ << " " << framework << ")\n";
    }
    ss << "\n";
    ss << "            target_link_libraries(" << name << "\n";
    for(auto const& library : b.externalLibraries)
    {
        ss << "                " << library << "\n";
    }
    for(int i = 0; i < count; i++)
    {
        ss << "                ${FRAMEWORK" << i <<  "}\n";
    }
    ss << "            )\n";

    return ss.str();
}